

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O1

void deqp::gls::StateQueryUtil::verifyBoolean
               (ResultCollector *result,QueriedState *state,bool expected)

{
  ostream *poVar1;
  ostringstream buf;
  string local_1d8;
  float local_1b4;
  ostringstream local_1b0 [112];
  ios_base local_140 [264];
  Enum<int,_1UL> local_38;
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if ((state->m_v).vBool == expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
    local_1d8._M_dataplus._M_p = (pointer)glu::getBooleanName;
    local_1d8._M_string_length._0_4_ = (uint)expected;
    poVar1 = tcu::Format::Enum<int,_1UL>::toStream
                       ((Enum<int,_1UL> *)&local_1d8,(ostream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    local_38.m_getName = glu::getBooleanName;
    local_38.m_value = (int)(state->m_v).vBool;
    tcu::Format::Enum<int,_1UL>::toStream(&local_38,poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_INTEGER:
    if ((state->m_v).vInt == (uint)expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
    poVar1 = (ostream *)std::ostream::operator<<(local_1b0,(uint)expected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::operator<<(poVar1,(state->m_v).vInt);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_INTEGER64:
    if ((state->m_v).vInt64 == (ulong)expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
    poVar1 = std::ostream::_M_insert<long>((long)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_FLOAT:
    if (expected) {
      local_1b4 = 1.0;
    }
    else {
      local_1b4 = 0.0;
    }
    if (((state->m_v).vFloat == local_1b4) && (!NAN((state->m_v).vFloat) && !NAN(local_1b4))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Expected ",9);
    poVar1 = std::ostream::_M_insert<double>((double)local_1b4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    std::ostream::_M_insert<double>((double)(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  default:
    goto switchD_0092c72e_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::ios_base::~ios_base(local_140);
switchD_0092c72e_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}